

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error adios2_engine_type(char *engine_type,size_t *size,adios2_io *io)

{
  allocator local_80 [32];
  string local_60;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_40,"for const adios2_io, in call to adios2_io_engine_type",local_80);
  adios2::helper::CheckForNullptr<adios2_io_const>(io,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string
            ((string *)&local_60,"for size_t* size, in call to adios2_io_engine_type",local_80);
  adios2::helper::CheckForNullptr<unsigned_long>(size,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  anon_unknown.dwarf_11ae2::String2CAPI((string *)(io + 0xa8),engine_type,size);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_type(char *engine_type, size_t *size, const adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for const adios2_io, in call to adios2_io_engine_type");
        adios2::helper::CheckForNullptr(size, "for size_t* size, in call to adios2_io_engine_type");

        const adios2::core::IO *ioCpp = reinterpret_cast<const adios2::core::IO *>(io);

        return String2CAPI(ioCpp->m_EngineType, engine_type, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_engine_type"));
    }
}